

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

TRef lj_opt_fwd_xload(jit_State *J)

{
  byte bVar1;
  IRIns *pIVar2;
  bool bVar3;
  ushort uVar4;
  AliasRet AVar5;
  int iVar6;
  TRef TVar7;
  byte bVar8;
  ushort uVar9;
  uint uVar10;
  long lVar11;
  ushort uVar12;
  uint uVar13;
  IRIns IVar14;
  IRIns *pIVar15;
  ulong unaff_RBP;
  uint uVar16;
  uint64_t u64;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  IRIns *pIVar21;
  ulong uVar22;
  ulong unaff_R13;
  
  uVar9 = (J->fold).ins.field_0.op1;
  uVar22 = (ulong)uVar9;
  uVar20 = (uint)uVar9;
  pIVar21 = (IRIns *)((ulong)((uint)uVar9 * 8) + (long)(J->cur).ir);
  uVar12 = (J->fold).ins.field_0.op2;
  if ((uVar12 & 1) != 0) {
    uVar16 = (uint)uVar9;
    goto LAB_00157730;
  }
  if ((uVar12 & 2) == 0) {
    uVar9 = J->chain[0x4e];
    do {
      unaff_RBP = (ulong)uVar9;
      uVar20 = (uint)uVar22;
      uVar16 = (uint)J->chain[99];
      if (J->chain[99] < uVar20) {
        uVar16 = uVar20;
      }
      if (uVar16 <= J->chain[0x5a]) {
        uVar16 = (uint)J->chain[0x5a];
      }
      uVar22 = unaff_R13 & 0xffffffff;
      do {
        uVar13 = (uint)uVar22;
        if ((uint)unaff_RBP <= uVar16) goto LAB_00157728;
        pIVar2 = (J->cur).ir;
        pIVar15 = pIVar2 + unaff_RBP;
        AVar5 = aa_xref(J,pIVar21,&(J->fold).ins,pIVar15);
        if (AVar5 == ALIAS_MAY) {
          iVar6 = 2;
          uVar16 = (uint)unaff_RBP;
        }
        else if (AVar5 == ALIAS_MUST) {
          bVar8 = *(byte *)((long)&(J->fold).ins + 4);
          uVar22 = (ulong)(pIVar15->field_0).op2;
          bVar1 = *(byte *)((long)pIVar2 + uVar22 * 8 + 4);
          if (((bVar1 ^ bVar8) & 0x1f) == 0) {
            iVar6 = 1;
          }
          else {
            uVar9 = bVar8 & 0x1f;
            if ((uVar9 == 0x11) || (uVar9 == 0xf)) {
              uVar12 = 0x13;
              uVar4 = uVar9 | 0x800;
            }
            else {
              uVar4 = bVar1 & 0x1f;
              uVar12 = uVar9;
              if ((bVar8 & 0x1d) == 0x10) {
                uVar12 = 0x13;
                uVar4 = uVar9;
              }
            }
            (J->fold).ins.field_0.ot = uVar12 + 0x5b00;
            (J->fold).ins.field_0.op1 = (pIVar15->field_0).op2;
            (J->fold).ins.field_0.op2 = uVar12 << 5 | uVar4;
            uVar22 = 1;
            iVar6 = 1;
          }
        }
        else {
          unaff_RBP = (ulong)(pIVar15->field_0).prev;
          iVar6 = 0;
        }
        uVar13 = (uint)uVar22;
      } while (iVar6 == 0);
      if (iVar6 != 2) {
        return uVar13;
      }
LAB_00157728:
      unaff_R13 = (ulong)uVar13;
LAB_00157730:
      uVar9 = J->chain[0x46];
      if (uVar16 < uVar9) {
        pIVar15 = (J->cur).ir;
        do {
          uVar22 = (ulong)uVar9;
          if ((uVar20 == pIVar15[uVar22].field_0.op1) &&
             ((((J->fold).ins.field_1.t.irt ^ *(byte *)((long)pIVar15 + uVar22 * 8 + 4)) & 0x1f) ==
              0)) {
            return (uint)uVar9;
          }
          uVar9 = *(ushort *)((long)pIVar15 + uVar22 * 8 + 6);
        } while (uVar16 < uVar9);
      }
      if (((((ulong)(J->fold).ins & 0x10000) != 0) || (J->chain[0x11] == 0)) ||
         (uVar20 != (J->fold).ins.field_0.op1)) break;
      if ((pIVar21->field_1).o == ')') {
        lVar11 = (long)(short)(pIVar21->field_0).op2;
        IVar14 = (IRIns)0x0;
        if (-1 < lVar11) {
          pIVar15 = (J->cur).ir;
          if (*(char *)((long)pIVar15 + lVar11 * 8 + 5) == '\x1d') {
            IVar14 = pIVar15[lVar11 + 1];
          }
          else {
            IVar14 = (IRIns)(long)pIVar15[lVar11].i;
          }
          pIVar21 = pIVar15 + (pIVar21->field_0).op1;
        }
      }
      else {
        IVar14 = (IRIns)0x0;
      }
      if ((pIVar21->field_1).o == ')') {
        pIVar2 = (J->cur).ir;
        pIVar15 = pIVar2 + (pIVar21->field_0).op1;
        if ((pIVar15->field_1).o == ')') {
          bVar8 = 1;
          if ((pIVar15->field_0).op1 != (pIVar15->field_0).op2) goto LAB_00157825;
        }
        else if (((pIVar15->field_1).o == '$') && (-1 < (long)(short)(pIVar15->field_0).op2)) {
          bVar8 = (byte)pIVar2[(short)(pIVar15->field_0).op2].field_1.op12;
        }
        else {
LAB_00157825:
          bVar8 = 0;
          pIVar15 = pIVar21;
        }
        uVar17 = (ulong)(pIVar15->field_0).op1;
        if (*(char *)((long)pIVar2 + uVar17 * 8 + 5) != ')') goto LAB_001579a8;
        uVar22 = 0;
        if (((*(byte *)((long)pIVar2 + uVar17 * 8 + 4) & 0x1f) == 0x13) &&
           (lVar11 = (long)*(short *)((long)pIVar2 + uVar17 * 8 + 2), -1 < lVar11)) {
          u64 = ((long)pIVar2[lVar11].i << (bVar8 & 0x3f)) + (long)IVar14;
          uVar9 = pIVar2[uVar17].field_0.op1;
          uVar20 = (uint)uVar9;
          if (pIVar15 != pIVar21) {
            unaff_RBP = (ulong)uVar16;
            uVar22 = (ulong)(pIVar15->field_1).o;
            uVar13 = (uint)uVar9;
            uVar20 = uVar13;
            if (uVar22 == 0x24) {
              uVar20 = (uint)(pIVar15->field_0).op2;
            }
            uVar10 = (uint)uVar9;
            uVar19 = uVar10;
            if (uVar20 < uVar13) {
              uVar19 = uVar20;
            }
            uVar18 = (uint)J->chain[uVar22];
            if (uVar20 >= uVar13 && uVar20 != uVar10) {
              uVar10 = uVar20;
            }
            do {
              if (uVar18 <= uVar10) {
                uVar20 = 0;
                break;
              }
              uVar17 = (ulong)uVar18;
              if ((uVar10 == pIVar2[uVar17].field_0.op1) &&
                 (uVar19 == *(ushort *)((long)pIVar2 + uVar17 * 8 + 2))) {
                bVar3 = false;
                uVar22 = (ulong)uVar18;
              }
              else {
                uVar18 = (uint)*(ushort *)((long)pIVar2 + uVar17 * 8 + 6);
                bVar3 = true;
              }
              uVar20 = (uint)uVar22;
            } while (bVar3);
            uVar22 = 0;
            if (uVar20 == 0) goto LAB_001579ab;
          }
          uVar19 = (uint)(pIVar21->field_0).op2;
          uVar13 = uVar20;
          if (uVar19 < uVar20) {
            uVar13 = uVar19;
          }
          uVar22 = (ulong)J->chain[0x29];
          if (uVar20 < uVar19) {
            uVar20 = (uint)(pIVar21->field_0).op2;
          }
          do {
            if ((uint)uVar22 <= uVar20) {
              uVar19 = 0;
              break;
            }
            if ((uVar20 == pIVar2[uVar22].field_0.op1) &&
               (uVar13 == *(ushort *)((long)pIVar2 + uVar22 * 8 + 2))) {
              bVar3 = false;
              unaff_RBP = uVar22;
            }
            else {
              uVar22 = (ulong)*(ushort *)((long)pIVar2 + uVar22 * 8 + 6);
              bVar3 = true;
            }
            uVar19 = (uint)unaff_RBP;
          } while (bVar3);
          if (uVar19 == 0) goto LAB_001579a8;
          if (u64 == 0) {
            uVar22 = (ulong)uVar19;
          }
          else {
            TVar7 = lj_ir_kint64(J,u64);
            uVar13 = TVar7 & 0xffff;
            uVar20 = uVar19;
            if (uVar13 < uVar19) {
              uVar20 = uVar13;
            }
            uVar10 = (uint)J->chain[0x29];
            if (uVar19 < uVar13) {
              uVar19 = uVar13;
            }
            do {
              if (uVar10 <= uVar19) goto LAB_001579a8;
              pIVar21 = (J->cur).ir;
              uVar17 = (ulong)uVar10;
              if ((uVar19 == pIVar21[uVar17].field_0.op1) &&
                 (uVar20 == *(ushort *)((long)pIVar21 + uVar17 * 8 + 2))) {
                bVar3 = false;
                uVar22 = (ulong)uVar10;
              }
              else {
                uVar10 = (uint)*(ushort *)((long)pIVar21 + uVar17 * 8 + 6);
                bVar3 = true;
              }
            } while (bVar3);
          }
        }
      }
      else {
LAB_001579a8:
        uVar22 = 0;
      }
LAB_001579ab:
      if ((int)uVar22 == 0) break;
      uVar9 = J->chain[0x4e];
      if (uVar16 < uVar9) {
        do {
          uVar9 = *(ushort *)((long)(J->cur).ir + (ulong)uVar9 * 8 + 6);
        } while (uVar16 < uVar9);
      }
      pIVar21 = (J->cur).ir + (uVar22 & 0xffffffff);
    } while( true );
  }
  TVar7 = lj_ir_emit(J);
  return TVar7;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_xload(jit_State *J)
{
  IRRef xref = fins->op1;
  IRIns *xr = IR(xref);
  IRRef lim = xref;  /* Search limit. */
  IRRef ref;

  if ((fins->op2 & IRXLOAD_READONLY))
    goto cselim;
  if ((fins->op2 & IRXLOAD_VOLATILE))
    goto doemit;

  /* Search for conflicting stores. */
  ref = J->chain[IR_XSTORE];
retry:
  if (J->chain[IR_CALLXS] > lim) lim = J->chain[IR_CALLXS];
  if (J->chain[IR_XBAR] > lim) lim = J->chain[IR_XBAR];
  while (ref > lim) {
    IRIns *store = IR(ref);
    switch (aa_xref(J, xr, fins, store)) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST:
      /* Emit conversion if the loaded type doesn't match the forwarded type. */
      if (!irt_sametype(fins->t, IR(store->op2)->t)) {
	IRType dt = irt_type(fins->t), st = irt_type(IR(store->op2)->t);
	if (dt == IRT_I8 || dt == IRT_I16) {  /* Trunc + sign-extend. */
	  st = dt | IRCONV_SEXT;
	  dt = IRT_INT;
	} else if (dt == IRT_U8 || dt == IRT_U16) {  /* Trunc + zero-extend. */
	  st = dt;
	  dt = IRT_INT;
	}
	fins->ot = IRT(IR_CONV, dt);
	fins->op1 = store->op2;
	fins->op2 = (dt<<5)|st;
	return RETRYFOLD;
      }
      return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[IR_XLOAD];
  while (ref > lim) {
    /* CSE for XLOAD depends on the type, but not on the IRXLOAD_* flags. */
    if (IR(ref)->op1 == xref && irt_sametype(IR(ref)->t, fins->t))
      return ref;
    ref = IR(ref)->prev;
  }

  /* Reassociate XLOAD across PHIs to handle a[i-1] forwarding case. */
  if (!(fins->op2 & IRXLOAD_READONLY) && J->chain[IR_LOOP] &&
      xref == fins->op1 && (xref = reassoc_xref(J, xr)) != 0) {
    ref = J->chain[IR_XSTORE];
    while (ref > lim)  /* Skip stores that have already been checked. */
      ref = IR(ref)->prev;
    lim = xref;
    xr = IR(xref);
    goto retry;  /* Retry with the reassociated reference. */
  }
doemit:
  return EMITFOLD;
}